

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O3

uint32_t lyjson_exp_number_copy_num_part
                   (char *num,uint32_t num_len,char *dec_point,int32_t dp_position,char *dst)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  long lVar4;
  
  if ((num == (char *)0x0) || (dst == (char *)0x0)) {
    __assert_fail("num && dst",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                  0x196,
                  "uint32_t lyjson_exp_number_copy_num_part(const char *, uint32_t, char *, int32_t, char *)"
                 );
  }
  uVar1 = 0x7fffffff;
  if (dec_point != (char *)0x0) {
    uVar1 = (int)dec_point - (int)num;
  }
  if ((-1 < (int)uVar1) && (uVar1 != dp_position)) {
    if (num_len == 0) {
      uVar2 = 0;
    }
    else {
      uVar3 = 0;
      uVar2 = 0;
      do {
        if (uVar1 != uVar3) {
          if (uVar2 == dp_position) {
            dst[dp_position] = '.';
            dst[(long)dp_position + 1] = num[uVar3];
            uVar2 = dp_position + 2;
          }
          else {
            lVar4 = (long)(int)uVar2;
            uVar2 = uVar2 + 1;
            dst[lVar4] = num[uVar3];
          }
        }
        uVar3 = uVar3 + 1;
      } while (num_len != uVar3);
    }
    return uVar2;
  }
  __assert_fail("(dec_point_idx >= 0) && (dec_point_idx != dp_position)",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                0x199,
                "uint32_t lyjson_exp_number_copy_num_part(const char *, uint32_t, char *, int32_t, char *)"
               );
}

Assistant:

static uint32_t
lyjson_exp_number_copy_num_part(const char *num, uint32_t num_len, char *dec_point, int32_t dp_position, char *dst)
{
    int32_t dec_point_idx;
    int32_t n, d;

    assert(num && dst);

    dec_point_idx = dec_point ? dec_point - num : INT32_MAX;
    assert((dec_point_idx >= 0) && (dec_point_idx != dp_position));

    for (n = 0, d = 0; (uint32_t)n < num_len; n++) {
        if (n == dec_point_idx) {
            continue;
        } else if (d == dp_position) {
            dst[d++] = '.';
            dst[d++] = num[n];
        } else {
            dst[d++] = num[n];
        }
    }

    return d;
}